

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filemgr.cc
# Opt level: O0

kvs_ops_stat * filemgr_migrate_op_stats(filemgr *old_file,filemgr *new_file,kvs_info *kvs)

{
  long in_RSI;
  long in_RDI;
  kvs_ops_stat *ret;
  undefined8 local_8;
  
  if (in_RSI == 0) {
    local_8 = (kvs_ops_stat *)0x0;
  }
  else {
    pthread_spin_lock((pthread_spinlock_t *)(in_RDI + 0x1a0));
    kvs_ops_stat::operator=((kvs_ops_stat *)new_file,(kvs_ops_stat *)kvs);
    local_8 = (kvs_ops_stat *)(in_RSI + 0x70);
    pthread_spin_unlock((pthread_spinlock_t *)(in_RDI + 0x1a0));
  }
  return local_8;
}

Assistant:

struct kvs_ops_stat *filemgr_migrate_op_stats(struct filemgr *old_file,
                                              struct filemgr *new_file,
                                              struct kvs_info *kvs)
{
    kvs_ops_stat *ret = NULL;
    if (new_file == NULL) {
        return NULL;
    }

    spin_lock(&old_file->lock);
    new_file->header.op_stat = old_file->header.op_stat;
    ret = &new_file->header.op_stat;
    spin_unlock(&old_file->lock);
    return ret;
}